

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# module-splitting.cpp
# Opt level: O0

Results * wasm::ModuleSplitting::splitFunctions
                    (Results *__return_storage_ptr__,Module *primary,Config *config)

{
  undefined1 local_1b0 [8];
  ModuleSplitter split;
  Config *config_local;
  Module *primary_local;
  
  split.internalLoadSecondaryModule.super_IString.str._M_str = (char *)config;
  anon_unknown_0::ModuleSplitter::ModuleSplitter((ModuleSplitter *)local_1b0,primary,config);
  std::unique_ptr<wasm::Module,_std::default_delete<wasm::Module>_>::unique_ptr
            (&__return_storage_ptr__->secondary,
             (unique_ptr<wasm::Module,_std::default_delete<wasm::Module>_> *)&split);
  std::
  map<unsigned_long,_wasm::Name,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_wasm::Name>_>_>
  ::map(&__return_storage_ptr__->placeholderMap,
        (map<unsigned_long,_wasm::Name,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_wasm::Name>_>_>
         *)&split.exportedPrimaryFuncs._M_t._M_impl.super__Rb_tree_header._M_node_count);
  anon_unknown_0::ModuleSplitter::~ModuleSplitter((ModuleSplitter *)local_1b0);
  return __return_storage_ptr__;
}

Assistant:

Results splitFunctions(Module& primary, const Config& config) {
  ModuleSplitter split(primary, config);
  return {std::move(split.secondaryPtr), std::move(split.placeholderMap)};
}